

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

EVP_PKEY * EVP_parse_private_key(CBS *cbs)

{
  _func_int_EVP_PKEY_ptr_CBS_ptr_CBS_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  EVP_PKEY *__p;
  pointer peVar4;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_60;
  UniquePtr<EVP_PKEY> ret;
  EVP_PKEY_ASN1_METHOD *method;
  uint64_t version;
  CBS key;
  CBS algorithm;
  CBS pkcs8;
  CBS *cbs_local;
  
  iVar3 = CBS_get_asn1(cbs,(CBS *)&algorithm.len,0x20000010);
  if ((((iVar3 != 0) &&
       (iVar3 = CBS_get_asn1_uint64((CBS *)&algorithm.len,(uint64_t *)&method), iVar3 != 0)) &&
      (method == (EVP_PKEY_ASN1_METHOD *)0x0)) &&
     ((iVar3 = CBS_get_asn1((CBS *)&algorithm.len,(CBS *)&key.len,0x20000010), iVar3 != 0 &&
      (iVar3 = CBS_get_asn1((CBS *)&algorithm.len,(CBS *)&version,4), iVar3 != 0)))) {
    ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         parse_key_type((CBS *)&key.len);
    if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
        ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
      ERR_put_error(6,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                    ,0x7a);
      return (EVP_PKEY *)0x0;
    }
    __p = EVP_PKEY_new();
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_60,(pointer)__p);
    bVar2 = std::operator==(&local_60,(nullptr_t)0x0);
    if (bVar2) {
      cbs_local = (CBS *)0x0;
    }
    else {
      peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_60);
      evp_pkey_set_method(peVar4,(EVP_PKEY_ASN1_METHOD *)
                                 ret._M_t.
                                 super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
      peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator->(&local_60);
      if (peVar4->ameth->priv_decode == (_func_int_EVP_PKEY_ptr_CBS_ptr_CBS_ptr *)0x0) {
        ERR_put_error(6,0,0x80,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                      ,0x89);
        cbs_local = (CBS *)0x0;
      }
      else {
        peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator->(&local_60);
        p_Var1 = peVar4->ameth->priv_decode;
        peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_60);
        iVar3 = (*p_Var1)(peVar4,(CBS *)&key.len,(CBS *)&version);
        if (iVar3 == 0) {
          cbs_local = (CBS *)0x0;
        }
        else {
          cbs_local = (CBS *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::release
                                       (&local_60);
        }
      }
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_60);
    return (EVP_PKEY *)cbs_local;
  }
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                ,0x75);
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_parse_private_key(CBS *cbs) {
  // Parse the PrivateKeyInfo.
  CBS pkcs8, algorithm, key;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &pkcs8, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&pkcs8, &version) ||
      version != 0 ||
      !CBS_get_asn1(&pkcs8, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&pkcs8, &key, CBS_ASN1_OCTETSTRING)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }
  const EVP_PKEY_ASN1_METHOD *method = parse_key_type(&algorithm);
  if (method == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }

  // A PrivateKeyInfo ends with a SET of Attributes which we ignore.

  // Set up an |EVP_PKEY| of the appropriate type.
  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  // Call into the type-specific PrivateKeyInfo decoding function.
  if (ret->ameth->priv_decode == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (!ret->ameth->priv_decode(ret.get(), &algorithm, &key)) {
    return nullptr;
  }

  return ret.release();
}